

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

void Bbl_ManDumpBinaryBlif(Bbl_Man_t *p,char *pFileName)

{
  Vec_Str_t *pVVar1;
  FILE *__s;
  
  __s = fopen(pFileName,"wb");
  pVVar1 = p->pName;
  fwrite(&pVVar1->nSize,4,1,__s);
  fwrite(pVVar1->pArray,1,(long)pVVar1->nSize,__s);
  pVVar1 = p->pObjs;
  fwrite(&pVVar1->nSize,4,1,__s);
  fwrite(pVVar1->pArray,1,(long)pVVar1->nSize,__s);
  pVVar1 = p->pFncs;
  fwrite(&pVVar1->nSize,4,1,__s);
  fwrite(pVVar1->pArray,1,(long)pVVar1->nSize,__s);
  fclose(__s);
  return;
}

Assistant:

void Bbl_ManDumpBinaryBlif( Bbl_Man_t * p, char * pFileName )
{
    FILE * pFile;
    pFile = fopen( pFileName, "wb" );
    Vec_StrWrite( pFile, p->pName );
    Vec_StrWrite( pFile, p->pObjs );
    Vec_StrWrite( pFile, p->pFncs );
    fclose( pFile );
}